

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_check_watchpoint_sparc(CPUState *cpu,uintptr_t retaddr)

{
  uint32_t local_44;
  tb_page_addr_t tStack_40;
  uint32_t flags;
  tb_page_addr_t addr;
  target_ulong_conflict cs_base;
  target_ulong_conflict pc;
  CPUArchState_conflict14 *env;
  TranslationBlock_conflict *tb;
  TCGContext_conflict7 *tcg_ctx;
  uintptr_t retaddr_local;
  CPUState *cpu_local;
  
  tb = (TranslationBlock_conflict *)cpu->uc->tcg_ctx;
  tcg_ctx = (TCGContext_conflict7 *)retaddr;
  retaddr_local = (uintptr_t)cpu;
  env = (CPUArchState_conflict14 *)tcg_tb_lookup_sparc((TCGContext_conflict7 *)tb,retaddr);
  if (env == (CPUArchState_conflict14 *)0x0) {
    _cs_base = *(CPUSPARCState **)(retaddr_local + 0x128);
    cpu_get_tb_cpu_state
              (_cs_base,(target_ulong_conflict *)((long)&addr + 4),(target_ulong_conflict *)&addr,
               &local_44);
    tStack_40 = get_page_addr_code_sparc(_cs_base,addr._4_4_);
    if (tStack_40 != 0xffffffffffffffff) {
      tb_invalidate_phys_range_sparc
                (*(uc_struct_conflict8 **)(retaddr_local + 0x81a8),tStack_40,tStack_40 + 1);
    }
  }
  else {
    cpu_restore_state_from_tb
              ((CPUState *)retaddr_local,(TranslationBlock_conflict *)env,(uintptr_t)tcg_ctx,true);
    tb_phys_invalidate_sparc
              ((TCGContext_conflict7 *)tb,(TranslationBlock_conflict *)env,0xffffffffffffffff);
  }
  return;
}

Assistant:

void tb_check_watchpoint(CPUState *cpu, uintptr_t retaddr)
{
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    TranslationBlock *tb;

    assert_memory_lock();

    tb = tcg_tb_lookup(tcg_ctx, retaddr);
    if (tb) {
        /* We can use retranslation to find the PC.  */
        cpu_restore_state_from_tb(cpu, tb, retaddr, true);
        tb_phys_invalidate(tcg_ctx, tb, -1);
    } else {
        /* The exception probably happened in a helper.  The CPU state should
           have been saved before calling it. Fetch the PC from there.  */
        CPUArchState *env = cpu->env_ptr;
        target_ulong pc, cs_base;
        tb_page_addr_t addr;
        uint32_t flags;

        cpu_get_tb_cpu_state(env, &pc, &cs_base, &flags);
        addr = get_page_addr_code(env, pc);
        if (addr != -1) {
            tb_invalidate_phys_range(cpu->uc, addr, addr + 1);
        }
    }
}